

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

VisitStatus
Fixpp::impl::
visitDictionary<Fixpp::v42::Spec::Dictionary,Fixpp::TypedParsingContext<void>,Fixpp::impl::MessageVisitor<should_visit_repeating_group_in_logon_frame::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>
          (TypedParsingContext<void> *context,
          MessageVisitor<should_visit_repeating_group_in_logon_frame::Visitor,_DefaultTestRules<Fixpp::v42::Spec::Dictionary>_>
          *visitor)

{
  bool bVar1;
  VisitStatus VVar2;
  
  bVar1 = v42::Version::equals
                    ((context->super_ParsingContext).version.first,
                     (context->super_ParsingContext).version.second);
  if (bVar1) {
    bVar1 = meta::typelist::ops::Visitor<$751c0b5c$>::
            visit<Fixpp::TypedParsingContext<void>_&,_Fixpp::impl::MessageVisitor<should_visit_repeating_group_in_logon_frame::Visitor,_DefaultTestRules<Fixpp::v42::Spec::Dictionary>_>_&>
                      (context,visitor);
    VVar2 = (uint)!bVar1 * 2;
  }
  else {
    VVar2 = VersionMismatch;
  }
  return VVar2;
}

Assistant:

VisitStatus visitDictionary(Context& context, Visitor& visitor, Rules)
        {
            using Version = typename Dictionary::Version;
            using Header = typename Dictionary::Header::Ref;
            using Messages = typename Dictionary::Messages;

            using Overrides = typename Rules::Overrides;

            auto version = context.version.first;
            auto versionSize = context.version.second;

            using MessageVisitor = DictionaryVisitor<Header, Overrides>;

            if (Version::equals(version, versionSize))
            {
                using AllMessagesVisitor = meta::typelist::ops::Visitor<Messages, MessageVisitor>;
                if (AllMessagesVisitor::visit(context, visitor))
                    return VisitStatus::Ok;

                return VisitStatus::NotFound;
            }

            return VisitStatus::VersionMismatch;
        }